

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AddScalarFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::CreateScalarFunctionInfo,std::default_delete<duckdb::CreateScalarFunctionInfo>,true>>
          (duckdb *this,AlterEntryData *args,
          unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
          *args_1)

{
  AddScalarFunctionOverloadInfo *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_98;
  AlterEntryData local_90;
  
  this_00 = (AddScalarFunctionOverloadInfo *)operator_new(0x80);
  AlterEntryData::AlterEntryData(&local_90,args);
  local_98._M_head_impl =
       (args_1->
       super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
       .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl;
  (args_1->
  super_unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateScalarFunctionInfo_*,_std::default_delete<duckdb::CreateScalarFunctionInfo>_>
  .super__Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false>._M_head_impl =
       (CreateScalarFunctionInfo *)0x0;
  AddScalarFunctionOverloadInfo::AddScalarFunctionOverloadInfo
            (this_00,&local_90,
             (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
              *)&local_98);
  *(AddScalarFunctionOverloadInfo **)this = this_00;
  if (local_98._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_98._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_98._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  AlterEntryData::~AlterEntryData(&local_90);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}